

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

void __thiscall vm::VM::Tscan<int>(VM *this)

{
  long *plVar1;
  undefined8 *puVar2;
  int value;
  
  plVar1 = (long *)std::istream::operator>>((istream *)&std::cin,&value);
  if ((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) == 0) {
    PUSH<int>(this,value);
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = &PTR__exception_00123d28;
  __cxa_throw(puVar2,&IOError::typeinfo,std::exception::~exception);
}

Assistant:

void VM::Tscan() {
    if (T value; std::cin >> value) {
        PUSH(value);
    }
    else {
        throw IOError();
    }
}